

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

value_type
pugi::impl::anon_unknown_0::utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
process<pugi::impl::(anonymous_namespace)::utf8_counter>(long data,long size)

{
  uint uVar1;
  value_type vVar2;
  long lVar3;
  long lVar4;
  
  vVar2 = 0;
  for (lVar3 = 0; size != lVar3; lVar3 = lVar3 + 1) {
    uVar1 = *(uint *)(data + lVar3 * 4);
    if (uVar1 < 0x10000) {
      lVar4 = 3 - (ulong)(uVar1 < 0x800);
      if (uVar1 < 0x80) {
        lVar4 = 1;
      }
      vVar2 = vVar2 + lVar4;
    }
    else {
      vVar2 = vVar2 + 4;
    }
  }
  return vVar2;
}

Assistant:

static inline typename Traits::value_type process(const uint32_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			while (size)
			{
				uint32_t lead = opt_swap::value ? endian_swap(*data) : *data;

				// U+0000..U+FFFF
				if (lead < 0x10000)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;
				}
				// U+10000..U+10FFFF
				else
				{
					result = Traits::high(result, lead);
					data += 1;
					size -= 1;
				}
			}

			return result;
		}